

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

void __thiscall kj::Thread::ThreadState::ThreadState(ThreadState *this,Function<void_()> *func)

{
  Function<void_()> *pFVar1;
  ExceptionCallback *pEVar2;
  Function<void_()> *func_local;
  ThreadState *this_local;
  
  pFVar1 = mv<kj::Function<void()>>(func);
  Function<void_()>::Function(&this->func,pFVar1);
  pEVar2 = getExceptionCallback();
  (*pEVar2->_vptr_ExceptionCallback[6])(&this->initializer);
  Maybe<kj::Exception>::Maybe(&this->exception,(void *)0x0);
  this->refcount = 2;
  return;
}

Assistant:

Thread::ThreadState::ThreadState(Function<void()> func)
    : func(kj::mv(func)),
      initializer(getExceptionCallback().getThreadInitializer()),
      exception(nullptr),
      refcount(2) {}